

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O2

void __thiscall
message_test_should_overwrite_tags_in_message_Test::
message_test_should_overwrite_tags_in_message_Test
          (message_test_should_overwrite_tags_in_message_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001750f0;
  return;
}

Assistant:

TEST(message_test, should_overwrite_tags_in_message)
{
    using namespace Fixpp;
    using MyTag = Fixpp::TagT<2154, Fixpp::Type::Int>;

    struct LogonOverwrite : public Fixpp::MessageOverwrite<Fixpp::v42::Message::Logon>
    {
        using OverwriteHeartBtInt = ChangeType<Of<Tag::HeartBtInt>, To<Type::String>>;
        using HeartBtStr = typename OverwriteHeartBtInt::Type;

        using Changes = ChangeSet<
           OverwriteHeartBtInt,
           AddTag<MyTag>
      >;
    };

    using MyMessage = LogonOverwrite::Changes::Apply;
    using HeartBtStr = LogonOverwrite::HeartBtStr;

    static constexpr size_t LogonTags = Fixpp::v42::Message::Logon::TotalTags;
    static constexpr size_t MyMessageTags = MyMessage::TotalTags;

    // MyMessage should have one more tag
    ASSERT_EQ(MyMessageTags, LogonTags + 1);

    MyMessage message;

    Fixpp::set<HeartBtStr>(message, "30s");
    ASSERT_EQ(Fixpp::get<HeartBtStr>(message), "30s");

    Fixpp::set<MyTag>(message, 1212);
    ASSERT_EQ(Fixpp::get<MyTag>(message), 1212);
}